

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbtrie.cc
# Opt level: O1

hbtrie_result hbtrie_iterator_init(hbtrie *trie,hbtrie_iterator *it,void *initial_key,size_t keylen)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  void *pvVar6;
  long lVar7;
  hbtrie *phVar8;
  hbtrie_iterator *phVar9;
  ulong __size;
  
  phVar8 = trie;
  phVar9 = it;
  for (lVar7 = 0xe; lVar7 != 0; lVar7 = lVar7 + -1) {
    uVar1 = phVar8->valuelen;
    uVar2 = phVar8->flag;
    uVar3 = phVar8->leaf_height_limit;
    uVar4 = phVar8->btree_nodesize;
    (phVar9->trie).chunksize = phVar8->chunksize;
    (phVar9->trie).valuelen = uVar1;
    (phVar9->trie).flag = uVar2;
    (phVar9->trie).leaf_height_limit = uVar3;
    (phVar9->trie).btree_nodesize = uVar4;
    phVar8 = (hbtrie *)&phVar8->root_bid;
    phVar9 = (hbtrie_iterator *)&(phVar9->trie).root_bid;
  }
  __size = (ulong)(it->trie).chunksize;
  pvVar6 = malloc(__size);
  (it->trie).last_map_chunk = pvVar6;
  memset(pvVar6,0xff,__size);
  pvVar6 = malloc(0x10000);
  it->curkey = pvVar6;
  if (initial_key == (void *)0x0) {
    it->keylen = 0;
  }
  else {
    uVar5 = _hbtrie_reform_key(trie,initial_key,(int)keylen,pvVar6);
    it->keylen = (long)(int)uVar5;
    if (0xffff < uVar5) {
      free(pvVar6);
      return HBTRIE_RESULT_FAIL;
    }
    pvVar6 = (void *)((long)pvVar6 + (long)(int)uVar5);
  }
  memset(pvVar6,0,(ulong)trie->chunksize);
  (it->btreeit_list).head = (list_elem *)0x0;
  (it->btreeit_list).tail = (list_elem *)0x0;
  it->flags = '\0';
  return HBTRIE_RESULT_SUCCESS;
}

Assistant:

hbtrie_result hbtrie_iterator_init(struct hbtrie *trie,
                                   struct hbtrie_iterator *it,
                                   void *initial_key,
                                   size_t keylen)
{
    it->trie = *trie;

    // MUST NOT affect the original trie due to sharing the same memory segment
    it->trie.last_map_chunk = (void *)malloc(it->trie.chunksize);
    memset(it->trie.last_map_chunk, 0xff, it->trie.chunksize);

    it->curkey = (void *)malloc(HBTRIE_MAX_KEYLEN);

    if (initial_key) {
        it->keylen = _hbtrie_reform_key(trie, initial_key, keylen, it->curkey);
        if (it->keylen >= HBTRIE_MAX_KEYLEN) {
            free(it->curkey);
            DBG("Error: HBTrie iterator init fails because the init key length %d is "
                "greater than the max key length %d\n", it->keylen, HBTRIE_MAX_KEYLEN);
            return HBTRIE_RESULT_FAIL;
        }
        memset((uint8_t*)it->curkey + it->keylen, 0, trie->chunksize);
    }else{
        it->keylen = 0;
        memset(it->curkey, 0, trie->chunksize);
    }
    list_init(&it->btreeit_list);
    it->flags = 0;

    return HBTRIE_RESULT_SUCCESS;
}